

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O1

void Aig_ManRandomInfo(Vec_Ptr_t *vInfo,int iInputStart,int iWordStart,int iWordStop)

{
  void *pvVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  if (iInputStart < vInfo->nSize) {
    uVar4 = (ulong)(uint)iInputStart;
    uVar2 = Aig_ManRandom::m_w;
    uVar3 = Aig_ManRandom::m_z;
    do {
      if (iInputStart < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (iWordStart < iWordStop) {
        pvVar1 = vInfo->pArray[uVar4];
        lVar5 = (long)iWordStart;
        do {
          uVar3 = (uVar3 >> 0x10) + (uVar3 & 0xffff) * 0x9069;
          uVar2 = (uVar2 >> 0x10) + (uVar2 & 0xffff) * 18000;
          *(uint *)((long)pvVar1 + lVar5 * 4) = uVar3 * 0x10000 + uVar2;
          lVar5 = lVar5 + 1;
          Aig_ManRandom::m_z = uVar3;
          Aig_ManRandom::m_w = uVar2;
        } while (iWordStop != lVar5);
      }
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < vInfo->nSize);
  }
  return;
}

Assistant:

void Aig_ManRandomInfo( Vec_Ptr_t * vInfo, int iInputStart, int iWordStart, int iWordStop )
{
    unsigned * pInfo;
    int i, w;
    Vec_PtrForEachEntryStart( unsigned *, vInfo, pInfo, i, iInputStart )
        for ( w = iWordStart; w < iWordStop; w++ )
            pInfo[w] = Aig_ManRandom(0);
}